

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O0

bool __thiscall
slang::parsing::Preprocessor::expandMacro
          (Preprocessor *this,MacroDef macro,MacroExpansion *expansion,
          MacroActualArgumentListSyntax *actualArgs)

{
  SourceLocation location;
  SourceLocation location_00;
  string_view rawText;
  Token sourceToken;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  string_view rawText_00;
  SourceRange expansionRange_00;
  string_view macroName_00;
  SourceRange expansionRange_01;
  SourceRange expansionRange_02;
  ulong uVar1;
  bool bVar2;
  int iVar5;
  reference peVar6;
  reference pTVar7;
  size_t sVar8;
  size_t sVar9;
  MacroActualArgumentSyntax *pMVar10;
  bool bVar3;
  StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>
  *pSVar11;
  const_reference pvVar12;
  size_type sVar13;
  undefined1 uVar4;
  undefined4 extraout_var;
  undefined8 in_RCX;
  EVP_PKEY_CTX *src;
  SmallVectorBase<slang::parsing::Trivia> *extraout_RDX;
  DefineDirectiveSyntax *in_RSI;
  long in_RDI;
  long in_R8;
  string_view sVar14;
  Token TVar15;
  string_view sVar16;
  basic_string_view<char,_std::char_traits<char>_> bVar17;
  Token empty;
  SourceLocation loc_1;
  SmallVector<slang::parsing::Trivia,_2UL> triviaBuf;
  Token t;
  iterator __end5;
  iterator __begin5;
  SmallVector<slang::parsing::Token,_8UL> *__range5;
  SmallVector<slang::parsing::Token,_8UL> splits;
  Token first;
  size_t index;
  Token token_1;
  iterator __end2;
  iterator __begin2;
  TokenList *__range2;
  anon_class_64_8_ed10e8cd handleToken;
  bool inDefineDirective;
  anon_class_32_4_0a8075ed append;
  SourceLocation expansionLoc;
  SourceLocation start;
  SourceRange expansionRange;
  Token endOfArgs;
  string_view name;
  TokenList *tokenList;
  MacroFormalArgumentSyntax *formal;
  size_t i;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
  argumentMap;
  SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *actualList;
  SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *formalList;
  Token token;
  iterator __end3;
  iterator __begin3;
  TokenList *__range3;
  SourceLocation expansionLoc_1;
  SourceLocation start_1;
  string_view macroName;
  TokenList *body;
  DefineDirectiveSyntax *directive;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  SourceLocation in_stack_fffffffffffff628;
  SourceLocation in_stack_fffffffffffff630;
  undefined6 in_stack_fffffffffffff638;
  undefined1 in_stack_fffffffffffff63e;
  undefined1 in_stack_fffffffffffff63f;
  Token *in_stack_fffffffffffff640;
  DiagCode code;
  SmallVectorBase<slang::parsing::Trivia> *in_stack_fffffffffffff648;
  MacroExpansion *in_stack_fffffffffffff650;
  size_t in_stack_fffffffffffff658;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
  *in_stack_fffffffffffff660;
  size_t in_stack_fffffffffffff668;
  Preprocessor *in_stack_fffffffffffff670;
  SourceLocation in_stack_fffffffffffff678;
  SourceLocation in_stack_fffffffffffff680;
  undefined7 uVar18;
  undefined1 in_stack_fffffffffffff68f;
  undefined1 uVar19;
  undefined7 in_stack_fffffffffffff690;
  undefined1 in_stack_fffffffffffff697;
  SourceLocation *in_stack_fffffffffffff698;
  undefined7 in_stack_fffffffffffff6a0;
  undefined1 in_stack_fffffffffffff6a7;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff6a8;
  Info *in_stack_fffffffffffff6b0;
  size_t in_stack_fffffffffffff6b8;
  SourceLocation in_stack_fffffffffffff6c0;
  SourceLocation in_stack_fffffffffffff6c8;
  char *in_stack_fffffffffffff6d0;
  SourceLocation in_stack_fffffffffffff6d8;
  SourceLocation in_stack_fffffffffffff6e0;
  SourceLocation in_stack_fffffffffffff6e8;
  SourceLocation local_7a8;
  undefined8 in_stack_fffffffffffff868;
  MacroIntrinsic intrinsic;
  Preprocessor *in_stack_fffffffffffff870;
  string_view local_768;
  SourceLocation local_758;
  SourceLocation local_750;
  basic_string_view<char,_std::char_traits<char>_> local_748;
  undefined1 local_731;
  SmallVectorBase<slang::parsing::Trivia> local_730;
  undefined8 local_6f8;
  Info *pIStack_6f0;
  undefined8 local_6e8;
  Info *pIStack_6e0;
  iterator local_6d0;
  iterator local_6c8;
  SmallVectorBase<slang::parsing::Token> *local_6c0;
  undefined8 local_6b8;
  Info *pIStack_6b0;
  SmallVectorBase<slang::parsing::Token> local_6a0 [2];
  anon_class_64_8_ed10e8cd *in_stack_fffffffffffff9c8;
  Token in_stack_fffffffffffff9d0;
  string_view local_5a8;
  string_view local_598;
  undefined8 local_588;
  Info *pIStack_580;
  Token *local_578;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  local_570;
  TokenList *local_568;
  undefined1 *local_560;
  undefined8 *local_558;
  undefined1 *local_550;
  undefined8 local_540;
  SourceLocation *local_538;
  SourceLocation *local_530;
  SourceRange *local_528;
  undefined1 local_519;
  undefined8 local_518;
  SourceLocation *local_510;
  SourceLocation *local_508;
  SourceRange *local_500;
  size_t local_4f8;
  char *pcStack_4f0;
  SourceLocation local_4e8;
  SourceLocation SStack_4e0;
  SourceLocation local_4d8;
  SourceLocation local_4d0;
  SourceLocation local_4c8;
  string_view local_4c0;
  SourceLocation local_4b0;
  SourceLocation local_4a8;
  SourceRange local_4a0;
  SourceLocation local_490;
  SourceRange local_488;
  Token local_478;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_468;
  undefined1 local_450 [24];
  string_view local_438;
  uint local_424;
  SourceLocation local_420;
  undefined4 local_414;
  TokenList *local_410;
  MacroFormalArgumentSyntax *local_3f8;
  ulong local_3f0;
  undefined1 local_3e8 [328];
  undefined1 local_2a0 [16];
  size_t local_290;
  ulong local_278;
  ulong local_270;
  Token local_268;
  SourceLocation local_258;
  undefined4 local_24c;
  long local_248;
  SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *local_240;
  SourceRange local_238;
  undefined8 local_228;
  Info *local_220;
  undefined8 local_218;
  Info *local_210;
  Token *local_208;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  local_200;
  TokenList *local_1f8;
  size_t local_1f0;
  char *local_1e8;
  SourceRange local_1e0;
  SourceLocation local_1d0;
  SourceLocation local_1c8;
  SourceLocation local_1c0;
  string_view local_1b8;
  TokenList *local_1a8;
  DefineDirectiveSyntax *local_1a0;
  long local_198;
  undefined8 local_190;
  MacroDef local_180;
  byte local_169;
  SourceLocation local_168;
  string_view *local_160;
  undefined1 *local_158;
  undefined1 local_149;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  local_148;
  SourceLocation local_140;
  basic_string_view<char,_std::char_traits<char>_> *local_138;
  undefined1 *local_130;
  bool local_121 [25];
  iterator local_108;
  bool local_f1 [25];
  iterator local_d8;
  bool local_c1;
  iterator local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>
  local_b0;
  size_t local_98;
  size_t local_90;
  basic_string_view<char,_std::char_traits<char>_> *local_88;
  SourceLocation local_80;
  basic_string_view<char,_std::char_traits<char>_> *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  undefined1 *local_8;
  
  intrinsic = (MacroIntrinsic)((ulong)in_stack_fffffffffffff868 >> 0x20);
  local_198 = in_R8;
  local_190 = in_RCX;
  local_180.syntax = in_RSI;
  bVar2 = MacroDef::isIntrinsic(&local_180);
  if (bVar2) {
    local_169 = expandIntrinsic(in_stack_fffffffffffff870,intrinsic,(MacroExpansion *)local_7a8);
  }
  else {
    local_1a0 = local_180.syntax;
    local_1a8 = &(local_180.syntax)->body;
    bVar2 = std::span<slang::parsing::Token,_18446744073709551615UL>::empty
                      ((span<slang::parsing::Token,_18446744073709551615UL> *)0xc5c5d7);
    if (bVar2) {
      local_169 = 1;
    }
    else {
      local_1b8 = Token::valueText(in_stack_fffffffffffff640);
      if (local_1a0->formalArguments == (MacroFormalArgumentListSyntax *)0x0) {
        peVar6 = std::span<slang::parsing::Token,_18446744073709551615UL>::operator[]
                           (&local_1a8->super_span<slang::parsing::Token,_18446744073709551615UL>,0)
        ;
        local_1d0 = Token::location(peVar6);
        local_1c0 = local_1d0;
        local_1e0 = MacroExpansion::getRange(in_stack_fffffffffffff650);
        local_1f0 = local_1b8._M_len;
        local_1e8 = local_1b8._M_str;
        expansionRange_01.endLoc = in_stack_fffffffffffff6e0;
        expansionRange_01.startLoc = in_stack_fffffffffffff6d8;
        macroName_00._M_str = in_stack_fffffffffffff6d0;
        macroName_00._M_len = (size_t)in_stack_fffffffffffff6c8;
        local_1c8 = SourceManager::createExpansionLoc
                              ((SourceManager *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6e8,
                               expansionRange_01,macroName_00);
        local_1f8 = local_1a8;
        local_200._M_current =
             (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::begin
                                ((span<slang::parsing::Token,_18446744073709551615UL> *)
                                 in_stack_fffffffffffff628);
        local_208 = (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::end
                                       ((span<slang::parsing::Token,_18446744073709551615UL> *)
                                        CONCAT17(in_stack_fffffffffffff63f,
                                                 CONCAT16(in_stack_fffffffffffff63e,
                                                          in_stack_fffffffffffff638)));
        while (bVar2 = __gnu_cxx::
                       operator==<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                                 ((__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffff630,
                                  (__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffff628), ((bVar2 ^ 0xffU) & 1) != 0) {
          pTVar7 = __gnu_cxx::
                   __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                   ::operator*(&local_200);
          local_228._0_2_ = pTVar7->kind;
          local_228._2_1_ = pTVar7->field_0x2;
          local_228._3_1_ = pTVar7->numFlags;
          local_228._4_4_ = pTVar7->rawLen;
          local_220 = pTVar7->info;
          local_218 = local_228;
          local_210 = local_220;
          local_238 = MacroExpansion::getRange(in_stack_fffffffffffff650);
          TVar15.info = in_stack_fffffffffffff6b0;
          TVar15._0_8_ = in_stack_fffffffffffff6a8;
          expansionRange_00.endLoc = in_stack_fffffffffffff6c8;
          expansionRange_00.startLoc = in_stack_fffffffffffff6c0;
          in_stack_fffffffffffff628 = local_238.startLoc;
          in_stack_fffffffffffff630 = local_238.endLoc;
          MacroExpansion::append
                    ((MacroExpansion *)CONCAT17(in_stack_fffffffffffff6a7,in_stack_fffffffffffff6a0)
                     ,TVar15,in_stack_fffffffffffff698,
                     (SourceLocation *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690)
                     ,expansionRange_00,(bool)in_stack_fffffffffffff68f);
          __gnu_cxx::
          __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
          ::operator++(&local_200);
        }
        local_169 = 1;
      }
      else {
        local_240 = &local_1a0->formalArguments->args;
        local_248 = local_198 + 0x28;
        sVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>::size
                          ((SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *)0xc5c85a
                          );
        sVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::size
                          ((SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *)0xc5c86f
                          );
        if (sVar9 < sVar8) {
          local_24c = 0x160004;
          local_268 = slang::syntax::SyntaxNode::getFirstToken
                                ((SyntaxNode *)in_stack_fffffffffffff660);
          code = SUB84((ulong)in_stack_fffffffffffff640 >> 0x20,0);
          local_258 = Token::location(&local_268);
          location._6_1_ = in_stack_fffffffffffff63e;
          location._0_6_ = in_stack_fffffffffffff638;
          location._7_1_ = in_stack_fffffffffffff63f;
          addDiag((Preprocessor *)in_stack_fffffffffffff630,code,location);
          local_169 = 0;
        }
        else {
          SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
          ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                      *)in_stack_fffffffffffff640);
          local_3f0 = 0;
          local_7a8 = in_stack_fffffffffffff628;
          while( true ) {
            uVar1 = local_3f0;
            sVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::
                    size((SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *)0xc5c91d);
            if (sVar8 <= uVar1) break;
            local_3f8 = slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>
                        ::operator[]((SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>
                                      *)in_stack_fffffffffffff630,(size_t)local_7a8);
            local_410 = (TokenList *)0x0;
            sVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>::
                    size((SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *)0xc5c979);
            if (local_3f0 < sVar8) {
              pMVar10 = slang::syntax::SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>
                        ::operator[]((SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>
                                      *)in_stack_fffffffffffff630,(size_t)local_7a8);
              local_410 = &pMVar10->tokens;
              bVar2 = std::span<slang::parsing::Token,_18446744073709551615UL>::empty
                                ((span<slang::parsing::Token,_18446744073709551615UL> *)0xc5c9cb);
              if ((bVar2) && (local_3f8->defaultValue != (MacroArgumentDefaultSyntax *)0x0)) {
                local_410 = &local_3f8->defaultValue->tokens;
              }
            }
            else {
              if (local_3f8->defaultValue == (MacroArgumentDefaultSyntax *)0x0) {
                local_414 = 0x140004;
                local_420 = Token::location((Token *)(local_198 + 0x60));
                location_00._6_1_ = in_stack_fffffffffffff63e;
                location_00._0_6_ = in_stack_fffffffffffff638;
                location_00._7_1_ = in_stack_fffffffffffff63f;
                addDiag((Preprocessor *)in_stack_fffffffffffff630,
                        SUB84((ulong)in_stack_fffffffffffff640 >> 0x20,0),location_00);
                local_169 = 0;
                local_424 = 1;
                goto LAB_00c5db2c;
              }
              local_410 = &local_3f8->defaultValue->tokens;
            }
            sVar14 = Token::valueText(in_stack_fffffffffffff640);
            local_438 = sVar14;
            bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_438);
            if (!bVar2) {
              expandMacro::ArgTokens::span
                        ((ArgTokens *)in_stack_fffffffffffff630,(TokenList *)local_7a8);
              local_160 = &local_438;
              local_168 = (SourceLocation)local_450;
              local_158 = local_2a0;
              local_140 = (SourceLocation)local_450;
              local_138 = local_160;
              local_130 = local_2a0;
              pSVar11 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                        ::al((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                              *)0xc5cba9);
              boost::unordered::detail::foa::
              alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
              ::alloc_cted_or_fwded_key_type(&local_148,pSVar11,local_138);
              local_78 = boost::unordered::detail::foa::
                         alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
                         ::move_or_fwd(&local_148);
              local_70 = &local_149;
              local_80 = local_140;
              local_68 = local_2a0;
              local_88 = boost::unordered::detail::foa::
                         table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,320ul,16ul>>
                         ::
                         key_from<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
                                   (local_78,local_140);
              local_90 = boost::unordered::detail::foa::
                         table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,320ul,16ul>>
                         ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                   ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                                     *)in_stack_fffffffffffff630,
                                    (basic_string_view<char,_std::char_traits<char>_> *)local_7a8);
              local_98 = boost::unordered::detail::foa::
                         table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                         ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                                         *)in_stack_fffffffffffff630,(size_t)local_7a8);
              local_10 = local_88;
              local_20 = local_90;
              local_18 = local_98;
              local_8 = local_2a0;
              boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                        (&local_30,local_98);
              do {
                local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
                local_40 = boost::unordered::detail::foa::
                           table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                           ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                                     *)0xc5cd27);
                local_40 = local_40 + local_38;
                local_44 = boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::match
                                     ((group15<boost::unordered::detail::foa::plain_integral> *)
                                      CONCAT17(in_stack_fffffffffffff63f,
                                               CONCAT16(in_stack_fffffffffffff63e,
                                                        in_stack_fffffffffffff638)),
                                      (size_t)in_stack_fffffffffffff630);
                if (local_44 != 0) {
                  local_50 = boost::unordered::detail::foa::
                             table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                             ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                                         *)0xc5cd89);
                  local_58 = local_50 + local_38 * 0xf;
                  do {
                    local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                    ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                            *)0xc5cddc);
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,320ul,16ul>>
                    ::
                    key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>
                              ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>
                                *)0xc5ce10);
                    bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                            operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                        *)in_stack_fffffffffffff650,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       in_stack_fffffffffffff648,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       in_stack_fffffffffffff640);
                    if (bVar2) {
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>
                      ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
                      goto LAB_00c5cf2c;
                    }
                    local_44 = local_44 - 1 & local_44;
                  } while (local_44 != 0);
                }
                bVar2 = boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                  ((group15<boost::unordered::detail::foa::plain_integral> *)
                                   in_stack_fffffffffffff630,(size_t)local_7a8);
                if (bVar2) {
                  memset(&local_b0,0,0x18);
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>
                  ::table_locator(&local_b0);
                  goto LAB_00c5cf2c;
                }
                bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                  (&local_30,local_290);
              } while (bVar2);
              memset(&local_b0,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>
              ::table_locator(&local_b0);
LAB_00c5cf2c:
              bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                                ((table_locator *)&local_b0);
              if (bVar2) {
                local_c0 = boost::unordered::detail::foa::
                           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                           ::make_iterator((locator *)0xc5cf4c);
                local_c1 = false;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                          (&local_468,&local_c0,&local_c1);
              }
              else if (local_270 < local_278) {
                local_7a8 = local_80;
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,320ul,16ul>>
                ::
                unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
                          (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                           (size_t)in_stack_fffffffffffff650,
                           (try_emplace_args_t *)in_stack_fffffffffffff648,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff640,(ArgTokens *)in_stack_fffffffffffff670);
                local_d8 = boost::unordered::detail::foa::
                           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                           ::make_iterator((locator *)0xc5cfee);
                local_f1[0] = true;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                          (&local_468,&local_d8,local_f1);
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,320ul,16ul>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
                          ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                            *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,
                           (try_emplace_args_t *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8
                           ,(ArgTokens *)
                            CONCAT17(in_stack_fffffffffffff6a7,in_stack_fffffffffffff6a0));
                local_108 = boost::unordered::detail::foa::
                            table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                            ::make_iterator((locator *)0xc5d069);
                local_121[0] = true;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                          (&local_468,&local_108,local_121);
              }
            }
            local_3f0 = local_3f0 + 1;
          }
          local_478 = slang::syntax::SyntaxNode::getLastToken
                                ((SyntaxNode *)in_stack_fffffffffffff660);
          local_4a0 = MacroExpansion::getRange(in_stack_fffffffffffff650);
          local_490 = SourceRange::start(&local_4a0);
          local_4b0 = Token::location(&local_478);
          local_4c0 = Token::rawText(in_stack_fffffffffffff640);
          std::basic_string_view<char,_std::char_traits<char>_>::length(&local_4c0);
          local_4a8 = SourceLocation::operator+<unsigned_long>
                                ((SourceLocation *)
                                 CONCAT17(in_stack_fffffffffffff63f,
                                          CONCAT16(in_stack_fffffffffffff63e,
                                                   in_stack_fffffffffffff638)),
                                 (unsigned_long)in_stack_fffffffffffff630);
          SourceRange::SourceRange(&local_488,local_490,local_4a8);
          peVar6 = std::span<slang::parsing::Token,_18446744073709551615UL>::operator[]
                             (&local_1a8->super_span<slang::parsing::Token,_18446744073709551615UL>,
                              0);
          local_4d8 = Token::location(peVar6);
          local_4e8 = local_488.startLoc;
          SStack_4e0 = local_488.endLoc;
          local_4f8 = local_1b8._M_len;
          pcStack_4f0 = local_1b8._M_str;
          expansionRange_02.endLoc = in_stack_fffffffffffff6e0;
          expansionRange_02.startLoc = in_stack_fffffffffffff6d8;
          sVar14._M_str = in_stack_fffffffffffff6d0;
          sVar14._M_len = (size_t)in_stack_fffffffffffff6c8;
          local_4c8 = local_4d8;
          local_4d0 = SourceManager::createExpansionLoc
                                ((SourceManager *)in_stack_fffffffffffff6c0,
                                 in_stack_fffffffffffff6e8,expansionRange_02,sVar14);
          local_518 = local_190;
          local_510 = &local_4d0;
          local_508 = &local_4c8;
          local_500 = &local_488;
          local_519 = 0;
          local_560 = &local_519;
          local_558 = &local_518;
          local_550 = local_3e8;
          local_540 = local_190;
          local_538 = &local_4d0;
          local_530 = &local_4c8;
          local_528 = &local_488;
          local_568 = local_1a8;
          local_570._M_current =
               (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::begin
                                  ((span<slang::parsing::Token,_18446744073709551615UL> *)local_7a8)
          ;
          local_578 = (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::end
                                         ((span<slang::parsing::Token,_18446744073709551615UL> *)
                                          CONCAT17(in_stack_fffffffffffff63f,
                                                   CONCAT16(in_stack_fffffffffffff63e,
                                                            in_stack_fffffffffffff638)));
          sVar16._M_str = (char *)in_stack_fffffffffffff660;
          sVar16._M_len = in_stack_fffffffffffff668;
          while( true ) {
            bVar2 = __gnu_cxx::
                    operator==<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                              ((__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                                *)in_stack_fffffffffffff630,
                               (__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                                *)local_7a8);
            if (((bVar2 ^ 0xffU) & 1) == 0) break;
            pTVar7 = __gnu_cxx::
                     __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                     ::operator*(&local_570);
            local_588._0_2_ = pTVar7->kind;
            local_588._2_1_ = pTVar7->field_0x2;
            local_588._3_1_ = pTVar7->numFlags;
            local_588._4_4_ = pTVar7->rawLen;
            pIStack_580 = pTVar7->info;
            bVar2 = false;
            if ((undefined2)local_588 == 2) {
              sVar14 = Token::rawText(in_stack_fffffffffffff640);
              local_598 = sVar14;
              bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_598);
              bVar2 = false;
              if (!bVar3) {
                sVar14 = Token::rawText(in_stack_fffffffffffff640);
                local_5a8 = sVar14;
                pvVar12 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                    (&local_5a8,0);
                bVar2 = *pvVar12 == '\\';
              }
            }
            if (bVar2) {
              Token::rawText(in_stack_fffffffffffff640);
              sVar13 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                 ((basic_string_view<char,_std::char_traits<char>_> *)
                                  in_stack_fffffffffffff650,(char *)in_stack_fffffffffffff648,
                                  (size_type)in_stack_fffffffffffff640);
              if (sVar13 == 0xffffffffffffffff) goto LAB_00c5dab3;
              Token::rawText(in_stack_fffffffffffff640);
              std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff650,(size_type)in_stack_fffffffffffff648,
                         (size_type)in_stack_fffffffffffff640);
              rawText._M_str = (char *)in_stack_fffffffffffff680;
              rawText._M_len = (size_t)in_stack_fffffffffffff678;
              TVar15 = Token::withRawText((Token *)in_stack_fffffffffffff670,
                                          (BumpAllocator *)sVar16._M_len,rawText);
              uVar4 = expandMacro::anon_class_64_8_ed10e8cd::operator()
                                (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9d0);
              if (!(bool)uVar4) {
                local_169 = 0;
                local_424 = 1;
                goto LAB_00c5db2c;
              }
              SmallVector<slang::parsing::Token,_8UL>::SmallVector
                        ((SmallVector<slang::parsing::Token,_8UL> *)0xc5d6d7);
              local_6b8 = local_588;
              pIStack_6b0 = pIStack_580;
              sourceToken.info = (Info *)in_stack_fffffffffffff680;
              sourceToken._0_8_ = in_stack_fffffffffffff678;
              splitTokens(in_stack_fffffffffffff670,sourceToken,sVar16._M_len,
                          (SmallVectorBase<slang::parsing::Token> *)sVar16._M_str);
              local_6c0 = local_6a0;
              local_6c8 = SmallVectorBase<slang::parsing::Token>::begin(local_6c0);
              local_6d0 = SmallVectorBase<slang::parsing::Token>::end(local_6c0);
              for (; local_6c8 != local_6d0; local_6c8 = local_6c8 + 1) {
                local_6f8._0_2_ = local_6c8->kind;
                local_6f8._2_1_ = local_6c8->field_0x2;
                local_6f8._3_1_ = local_6c8->numFlags;
                local_6f8._4_4_ = local_6c8->rawLen;
                pIStack_6f0 = local_6c8->info;
                local_6e8 = local_6f8;
                pIStack_6e0 = pIStack_6f0;
                in_stack_fffffffffffff697 =
                     expandMacro::anon_class_64_8_ed10e8cd::operator()
                               (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9d0);
                if (!(bool)in_stack_fffffffffffff697) {
                  local_169 = 0;
                  local_424 = 1;
                  goto LAB_00c5da81;
                }
              }
              bVar2 = SmallVectorBase<slang::parsing::Token>::empty(local_6a0);
              if (bVar2) {
LAB_00c5da76:
                local_424 = 0xe;
              }
              else {
                uVar18 = SUB87(&local_730,0);
                uVar19 = (undefined1)((ulong)&local_730 >> 0x38);
                SmallVector<slang::parsing::Trivia,_2UL>::SmallVector
                          ((SmallVector<slang::parsing::Trivia,_2UL> *)0xc5d826);
                local_731 = 1;
                local_748 = ::sv((char *)in_stack_fffffffffffff630,(size_t)local_7a8);
                SmallVectorBase<slang::parsing::Trivia>::
                emplace_back<slang::parsing::TriviaKind,std::basic_string_view<char,std::char_traits<char>>>
                          (in_stack_fffffffffffff648,(TriviaKind *)in_stack_fffffffffffff640,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT17(in_stack_fffffffffffff63f,
                                    CONCAT16(in_stack_fffffffffffff63e,in_stack_fffffffffffff638)));
                in_stack_fffffffffffff680 =
                     (SourceLocation)SmallVectorBase<slang::parsing::Token>::back(local_6a0);
                in_stack_fffffffffffff678 = Token::location((Token *)in_stack_fffffffffffff680);
                local_758 = in_stack_fffffffffffff678;
                in_stack_fffffffffffff670 =
                     (Preprocessor *)SmallVectorBase<slang::parsing::Token>::back(local_6a0);
                sVar16 = Token::rawText(in_stack_fffffffffffff640);
                local_768 = sVar16;
                std::basic_string_view<char,_std::char_traits<char>_>::length(&local_768);
                local_750 = SourceLocation::operator+<unsigned_long>
                                      ((SourceLocation *)
                                       CONCAT17(in_stack_fffffffffffff63f,
                                                CONCAT16(in_stack_fffffffffffff63e,
                                                         in_stack_fffffffffffff638)),
                                       (unsigned_long)in_stack_fffffffffffff630);
                in_stack_fffffffffffff640 = *(Token **)(in_RDI + 8);
                iVar5 = SmallVectorBase<slang::parsing::Trivia>::copy
                                  (&local_730,(EVP_PKEY_CTX *)in_stack_fffffffffffff640,src);
                in_stack_fffffffffffff650 = (MacroExpansion *)CONCAT44(extraout_var,iVar5);
                in_stack_fffffffffffff648 = extraout_RDX;
                std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
                span<slang::parsing::Trivia,_18446744073709551615UL>
                          ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
                           in_stack_fffffffffffff640,
                           (span<slang::parsing::Trivia,_18446744073709551615UL> *)
                           CONCAT17(in_stack_fffffffffffff63f,
                                    CONCAT16(in_stack_fffffffffffff63e,in_stack_fffffffffffff638)));
                bVar17 = ::sv((char *)in_stack_fffffffffffff630,(size_t)local_7a8);
                local_7a8 = (SourceLocation)bVar17._M_len;
                in_stack_fffffffffffff630 = (SourceLocation)bVar17._M_str;
                trivia._M_ptr._7_1_ = uVar19;
                trivia._M_ptr._0_7_ = uVar18;
                trivia._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff690;
                trivia._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff697;
                rawText_00._M_len._7_1_ = uVar4;
                rawText_00._M_len._0_7_ = in_stack_fffffffffffff6a0;
                rawText_00._M_str = (char *)TVar15.info;
                Token::Token((Token *)in_stack_fffffffffffff678,
                             (BumpAllocator *)in_stack_fffffffffffff670,sVar16._M_len._6_2_,trivia,
                             rawText_00,in_stack_fffffffffffff680);
                in_stack_fffffffffffff63f =
                     expandMacro::anon_class_64_8_ed10e8cd::operator()
                               (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9d0);
                if (!(bool)in_stack_fffffffffffff63f) {
                  local_169 = 0;
                }
                local_424 = (uint)!(bool)in_stack_fffffffffffff63f;
                SmallVector<slang::parsing::Trivia,_2UL>::~SmallVector
                          ((SmallVector<slang::parsing::Trivia,_2UL> *)0xc5da67);
                if (local_424 == 0) goto LAB_00c5da76;
              }
LAB_00c5da81:
              SmallVector<slang::parsing::Token,_8UL>::~SmallVector
                        ((SmallVector<slang::parsing::Token,_8UL> *)0xc5da8e);
              if (local_424 != 0xe) goto LAB_00c5db2c;
            }
            else {
LAB_00c5dab3:
              in_stack_fffffffffffff63e =
                   expandMacro::anon_class_64_8_ed10e8cd::operator()
                             (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9d0);
              if (!(bool)in_stack_fffffffffffff63e) {
                local_169 = 0;
                local_424 = 1;
                goto LAB_00c5db2c;
              }
            }
            __gnu_cxx::
            __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
            ::operator++(&local_570);
          }
          local_169 = 1;
          local_424 = 1;
LAB_00c5db2c:
          SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
          ::~SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                       *)0xc5db39);
        }
      }
    }
  }
  return (bool)(local_169 & 1);
}

Assistant:

bool Preprocessor::expandMacro(MacroDef macro, MacroExpansion& expansion,
                               MacroActualArgumentListSyntax* actualArgs) {
    if (macro.isIntrinsic()) {
        // for now, no intrisics can have arguments
        SLANG_ASSERT(!actualArgs);
        return expandIntrinsic(macro.intrinsic, expansion);
    }

    const DefineDirectiveSyntax* directive = macro.syntax;
    SLANG_ASSERT(directive);

    // ignore empty macro
    const auto& body = directive->body;
    if (body.empty())
        return true;

    std::string_view macroName = directive->name.valueText();

    if (!directive->formalArguments) {
        // each macro expansion gets its own location entry
        SourceLocation start = body[0].location();
        SourceLocation expansionLoc = sourceManager.createExpansionLoc(start, expansion.getRange(),
                                                                       macroName);

        // simple macro; just take body tokens
        for (auto token : body)
            expansion.append(token, expansionLoc, start, expansion.getRange());

        return true;
    }

    // match up actual arguments with formal parameters
    SLANG_ASSERT(actualArgs);
    auto& formalList = directive->formalArguments->args;
    auto& actualList = actualArgs->args;
    if (actualList.size() > formalList.size()) {
        addDiag(diag::TooManyActualMacroArgs, actualArgs->getFirstToken().location());
        return false;
    }

    struct ArgTokens : public std::span<const Token> {
        using std::span<const Token>::span;
        using std::span<const Token>::operator=;
        bool isExpanded = false;
    };
    SmallMap<std::string_view, ArgTokens, 8> argumentMap;

    for (size_t i = 0; i < formalList.size(); i++) {
        auto formal = formalList[i];
        const TokenList* tokenList = nullptr;
        if (actualList.size() > i) {
            // if our actual argument is empty and we have a default, take that
            tokenList = &actualList[i]->tokens;
            if (tokenList->empty() && formal->defaultValue)
                tokenList = &formal->defaultValue->tokens;
        }
        else {
            // if we've run out of actual args make sure we have a default for this one
            if (formal->defaultValue)
                tokenList = &formal->defaultValue->tokens;
            else {
                addDiag(diag::NotEnoughMacroArgs, actualArgs->closeParen.location());
                return false;
            }
        }

        auto name = formal->name.valueText();
        if (!name.empty())
            argumentMap.emplace(name, ArgTokens(*tokenList));
    }

    Token endOfArgs = actualArgs->getLastToken();
    SourceRange expansionRange(expansion.getRange().start(),
                               endOfArgs.location() + endOfArgs.rawText().length());

    SourceLocation start = body[0].location();
    SourceLocation expansionLoc = sourceManager.createExpansionLoc(start, expansionRange,
                                                                   macroName);

    auto append = [&](Token token) {
        expansion.append(token, expansionLoc, start, expansionRange);
        return true;
    };

    bool inDefineDirective = false;

    auto handleToken = [&](Token token) {
        if (inDefineDirective && !token.isOnSameLine())
            inDefineDirective = false;

        if (token.kind != TokenKind::Identifier && !LF::isKeyword(token.kind) &&
            token.kind != TokenKind::Directive) {
            // Non-identifier, can't be argument substituted.
            return append(token);
        }

        std::string_view text = token.valueText();
        if (token.kind == TokenKind::Directive && !text.empty()) {
            if (token.directiveKind() != SyntaxKind::MacroUsage) {
                // If this is the start of a `define directive, note that fact because
                // during argument expansion we will insert line continuations.
                if (token.directiveKind() == SyntaxKind::DefineDirective)
                    inDefineDirective = true;
                return append(token);
            }

            // Other tools allow arguments to replace matching directive names, e.g.:
            // `define FOO(bar) `bar
            // `define ONE 1
            // `FOO(ONE)   // expands to 1
            text = text.substr(1);
        }

        // check for formal param
        auto it = argumentMap.find(text);
        if (it == argumentMap.end())
            return append(token);

        // Fully expand out arguments before substitution to make sure we can detect whether
        // a usage of a macro in a replacement list is valid or an illegal recursion.
        if (!it->second.isExpanded) {
            std::span<const Token> argTokens = it->second;
            SmallSet<const DefineDirectiveSyntax*, 8> alreadyExpanded;
            if (!expandReplacementList(argTokens, alreadyExpanded))
                return false;

            it->second = argTokens;
            it->second.isExpanded = true;
        }

        auto begin = it->second.begin();
        auto end = it->second.end();
        if (begin == end) {
            // The macro argument contained no tokens. We still need to supply an empty token
            // here to ensure that the trivia of the formal parameter is passed on.
            Token empty(alloc, TokenKind::EmptyMacroArgument, token.trivia(), ""sv,
                        token.location());
            return append(empty);
        }

        // We need to ensure that we get correct spacing for the leading token here;
        // it needs to come from the *formal* parameter used in the macro body, not
        // from the argument itself.
        Token first = begin->withTrivia(alloc, token.trivia());
        SourceLocation firstLoc = first.location();

        // Arguments need their own expansion location created; the original
        // location comes from the source file itself, and the expansion location
        // points into the macro body where the formal argument was used.
        SourceLocation tokenLoc = expansion.adjustLoc(token, expansionLoc, start, expansionRange);
        SourceRange argRange(tokenLoc, tokenLoc + token.rawText().length());
        SourceLocation argLoc = sourceManager.createExpansionLoc(firstLoc, argRange, true);

        // See note above about weird macro usage being argument replaced.
        // In that case we want to fabricate the correct directive token here.
        if (token.kind == TokenKind::Directive) {
            Token grave(alloc, TokenKind::Unknown, first.trivia(), "`"sv, firstLoc);
            Token combined = Lexer::concatenateTokens(alloc, sourceManager, grave, first);
            if (combined) {
                first = combined;
            }
            else {
                // Failed to combine, so ignore the grave and issue an error.
                addDiag(diag::MisplacedDirectiveChar, firstLoc);
            }
        }

        if (inDefineDirective) {
            // Inside a define directive we need to insert line continuations
            // any time an expanded token will end up on a new line.
            auto appendBody = [&](Token token) {
                if (!token.isOnSameLine()) {
                    Token lc(alloc, TokenKind::LineContinuation, token.trivia(), "\\"sv,
                             token.location());
                    expansion.append(lc, argLoc, firstLoc, argRange,
                                     /* allowLineContinuation */ true);

                    token = token.withTrivia(alloc, {});
                }
                expansion.append(token, argLoc, firstLoc, argRange);
            };

            appendBody(first);
            for (++begin; begin != end; begin++)
                appendBody(*begin);
        }
        else {
            expansion.append(first, argLoc, firstLoc, argRange);
            for (++begin; begin != end; begin++)
                expansion.append(*begin, argLoc, firstLoc, argRange);
        }

        return true;
    };

    // Now add each body token, substituting arguments as necessary.
    for (auto token : body) {
        if (token.kind == TokenKind::Identifier && !token.rawText().empty() &&
            token.rawText()[0] == '\\') {
            // Escaped identifier, might need to break apart and substitute
            // individual pieces of it.
            size_t index = token.rawText().find("``");
            if (index != std::string_view::npos) {
                Token first = token.withRawText(alloc, token.rawText().substr(0, index));
                if (!handleToken(first))
                    return false;

                SmallVector<Token, 8> splits;
                splitTokens(token, index, splits);
                for (auto t : splits) {
                    if (!handleToken(t))
                        return false;
                }

                // Add an empty argument in here so we can make sure a space ends
                // the escaped identifier once it gets concatenated again.
                if (!splits.empty()) {
                    SmallVector<Trivia> triviaBuf;
                    triviaBuf.emplace_back(TriviaKind::Whitespace, " "sv);

                    auto loc = splits.back().location() + splits.back().rawText().length();
                    Token empty(alloc, TokenKind::EmptyMacroArgument, triviaBuf.copy(alloc), ""sv,
                                loc);

                    if (!handleToken(empty))
                        return false;
                }

                continue;
            }
        }

        if (!handleToken(token))
            return false;
    }

    return true;
}